

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_patch
          (BinBinaryReader *this,Hash *patchKeyHash,Embed *patch)

{
  BinaryReader *this_00;
  uint uVar1;
  bool bVar2;
  ssize_t sVar3;
  size_t in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nbytes;
  uint *puVar4;
  void *__buf;
  uint *pos;
  char *pcVar5;
  Type type;
  String name;
  allocator<char> local_232;
  Type local_231;
  char *local_230;
  String local_228;
  _Variadic_union<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_208;
  undefined8 local_1c8;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  Field local_130;
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_c0;
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_78;
  
  this_00 = &this->reader;
  puVar4 = (uint *)(this->reader).cur_;
  sVar3 = BinaryReader::read(this_00,(int)patchKeyHash,patch,in_RCX);
  if ((char)sVar3 == '\0') {
    pcVar5 = "reader.read(patchKeyHash.value)";
LAB_00110096:
    bVar2 = fail_msg(this,pcVar5,(char *)puVar4);
    return bVar2;
  }
  puVar4 = (uint *)(this->reader).cur_;
  pos = puVar4 + 1;
  if ((this->reader).cap_ < pos) {
    pcVar5 = "reader.read(patchLength)";
    goto LAB_00110096;
  }
  uVar1 = *puVar4;
  (this->reader).cur_ = (char *)pos;
  pcVar5 = (this->reader).beg_;
  local_231 = NONE;
  __nbytes = &local_228.value.field_2;
  local_228.value._M_string_length = 0;
  local_228.value.field_2._M_local_buf[0] = '\0';
  local_208._48_8_ = 0;
  local_208._56_8_ = 0;
  local_208._32_8_ = 0;
  local_208._40_8_ = 0;
  local_208._16_8_ = 0;
  local_208._24_8_ = 0;
  local_208._0_8_ = 0;
  local_208._8_8_ = 0;
  local_1c8 = 0;
  local_228.value._M_dataplus._M_p = (pointer)__nbytes;
  sVar3 = BinaryReader::read(this_00,(int)&local_231,puVar4,(size_t)__nbytes);
  if ((char)sVar3 == '\0') {
    pcVar5 = "reader.read(type)";
  }
  else {
    puVar4 = (uint *)(this->reader).cur_;
    local_230 = pcVar5;
    sVar3 = BinaryReader::read(this_00,(int)&local_228,__buf,(size_t)__nbytes);
    if ((char)sVar3 == '\0') {
      pcVar5 = "reader.read(name.value)";
      pos = puVar4;
    }
    else {
      puVar4 = (uint *)(this->reader).cur_;
      bVar2 = read_value_of(this,(Value *)&local_208,local_231);
      if (bVar2) {
        puVar4 = (uint *)(this->reader).cur_;
        if ((long)puVar4 - (long)(this->reader).beg_ == (long)pos + ((ulong)uVar1 - (long)local_230)
           ) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"path",&local_232)
          ;
          FNV1a::FNV1a((FNV1a *)local_158,&local_1a0);
          std::
          variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
          ::variant<ritobin::String,void,void,ritobin::String,void>
                    ((variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
                      *)&local_78,&local_228);
          Field::Field(&local_130,(FNV1a *)local_158,(Value *)&local_78);
          std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<ritobin::Field>
                    (&patch->items,&local_130);
          Field::~Field(&local_130);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage(&local_78);
          std::__cxx11::string::~string((string *)(local_158 + 8));
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,"value",&local_232);
          FNV1a::FNV1a((FNV1a *)local_180,&local_1c0);
          std::__detail::__variant::
          _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_c0,
                            (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_208);
          Field::Field(&local_130,(FNV1a *)local_180,(Value *)&local_c0);
          std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<ritobin::Field>
                    (&patch->items,&local_130);
          Field::~Field(&local_130);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage(&local_c0);
          std::__cxx11::string::~string((string *)(local_180 + 8));
          std::__cxx11::string::~string((string *)&local_1c0);
          bVar2 = true;
          goto LAB_001102c7;
        }
        pcVar5 = "reader.position() == position + patchLength";
        pos = puVar4;
      }
      else {
        pcVar5 = "read_value_of(value, type)";
        pos = puVar4;
      }
    }
  }
  bVar2 = fail_msg(this,pcVar5,(char *)pos);
LAB_001102c7:
  std::__detail::__variant::
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                       *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  return bVar2;
}

Assistant:

bool read_patch(Hash& patchKeyHash, Embed& patch) {
            uint32_t patchLength = 0;
            bin_assert(reader.read(patchKeyHash.value));
            bin_assert(reader.read(patchLength));
            auto position = reader.position();
            Type type = {};
            String name = {};
            Value value = {};
            bin_assert(reader.read(type));
            bin_assert(reader.read(name.value));
            bin_assert(read_value_of(value, type));
            bin_assert(reader.position() == position + patchLength);
            patch.items.emplace_back(Field { {"path"}, std::move(name) });
            patch.items.emplace_back(Field { {"value"}, std::move(value) });
            return true;
        }